

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_psrldq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = s->_l_ZMMReg[0];
  uVar2 = 0x10;
  if ((int)uVar1 < 0x10) {
    uVar2 = uVar1;
  }
  uVar3 = 0x10 - uVar2;
  if ((int)uVar1 < 0x10) {
    uVar4 = 1;
    if (1 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    uVar5 = 0;
    do {
      d->_b_ZMMReg[uVar5] = d->_b_ZMMReg[uVar5 + (long)(int)uVar2];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    if ((int)uVar1 < 1) {
      return;
    }
  }
  memset((void *)((long)d + (long)(int)uVar3),0,(ulong)uVar2);
  return;
}

Assistant:

void glue(helper_psrldq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift, i;

    shift = s->L(0);
    if (shift > 16) {
        shift = 16;
    }
    for (i = 0; i < 16 - shift; i++) {
        d->B(i) = d->B(i + shift);
    }
    for (i = 16 - shift; i < 16; i++) {
        d->B(i) = 0;
    }
}